

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::WireFormat::FieldDataOnlyByteSize
                 (FieldDescriptor *field,Message *message)

{
  FieldDescriptor *field_00;
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  Type TVar5;
  undefined4 extraout_var;
  MapFieldBase *this;
  Descriptor *pDVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  long *plVar11;
  long *plVar12;
  size_t sVar13;
  ulong uVar14;
  MapIterator iter;
  MapIterator end;
  MapIterator local_90;
  MapIterator local_60;
  
  iVar3 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar12 = (long *)CONCAT44(extraout_var,iVar3);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this = (MapFieldBase *)(**(code **)(*plVar12 + 0x2d8))(plVar12,message,field);
    bVar1 = MapFieldBase::IsMapValid(this);
    if (bVar1) {
      MapIterator::MapIterator(&local_90,message,field);
      MapIterator::MapIterator(&local_60,message,field);
      pDVar6 = FieldDescriptor::message_type(field);
      field_00 = *(FieldDescriptor **)(pDVar6 + 0x30);
      pDVar6 = FieldDescriptor::message_type(field);
      lVar9 = *(long *)(pDVar6 + 0x30);
      (*this->_vptr_MapFieldBase[6])(this,&local_90);
      (*this->_vptr_MapFieldBase[7])(this,&local_60);
      sVar13 = 0;
      while (iVar3 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60),
            (char)iVar3 == '\0') {
        sVar7 = MapKeyDataOnlyByteSize(field_00,&local_90.key_);
        sVar8 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar9 + 0xa8),&local_90.value_);
        uVar4 = (int)sVar8 + (int)sVar7 + 2U | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar13 = sVar13 + sVar8 + sVar7 + 2 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        (*(local_90.map_)->_vptr_MapFieldBase[0xf])(local_90.map_,&local_90);
      }
      MapIterator::~MapIterator(&local_60);
      MapIterator::~MapIterator(&local_90);
      return sVar13;
    }
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar4 = (**(code **)(*plVar12 + 0x30))(plVar12,message,field);
    sVar13 = (size_t)uVar4;
  }
  else {
    sVar13 = 1;
    if (*(char *)(*(long *)(*(long *)(field + 0x58) + 0x20) + 0x6b) == '\0') {
      bVar2 = (**(code **)(*plVar12 + 0x28))(plVar12,message,field);
      sVar13 = (size_t)bVar2;
    }
  }
  TVar5 = FieldDescriptor::type(field);
  switch(TVar5) {
  case TYPE_DOUBLE:
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    return sVar13 << 3;
  case TYPE_FLOAT:
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    return sVar13 << 2;
  case TYPE_INT64:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        uVar10 = (**(code **)(*plVar12 + 0x158))(plVar12,message,field,uVar14 & 0xffffffff);
        lVar9 = 0x3f;
        if ((uVar10 | 1) != 0) {
          for (; (uVar10 | 1) >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        sVar7 = sVar7 + ((int)lVar9 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    uVar14 = (**(code **)(*plVar12 + 0x90))(plVar12,message,field);
    goto LAB_005ce236;
  case TYPE_UINT64:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        uVar10 = (**(code **)(*plVar12 + 0x168))(plVar12,message,field,uVar14 & 0xffffffff);
        lVar9 = 0x3f;
        if ((uVar10 | 1) != 0) {
          for (; (uVar10 | 1) >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        sVar7 = sVar7 + ((int)lVar9 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    uVar14 = (**(code **)(*plVar12 + 0xa0))(plVar12,message,field);
    goto LAB_005ce236;
  case TYPE_INT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        uVar4 = (**(code **)(*plVar12 + 0x150))(plVar12,message,field,uVar14 & 0xffffffff);
        if ((int)uVar4 < 0) {
          uVar10 = 10;
        }
        else {
          iVar3 = 0x1f;
          if ((uVar4 | 1) != 0) {
            for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar10 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        sVar7 = sVar7 + uVar10;
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    uVar4 = (**(code **)(*plVar12 + 0x88))(plVar12,message,field);
    goto LAB_005ce1e1;
  case TYPE_BOOL:
    return sVar13;
  case TYPE_STRING:
  case TYPE_BYTES:
    if (sVar13 != 0) {
      uVar14 = 0;
      sVar7 = 0;
      do {
        local_90.iter_ = &local_90.key_;
        local_90.map_ = (MapFieldBase *)0x0;
        local_90.key_.val_.bool_value_ = false;
        if (*(int *)(field + 0x4c) == 3) {
          lVar9 = (**(code **)(*plVar12 + 0x1a8))
                            (plVar12,message,field,uVar14 & 0xffffffff,&local_90);
        }
        else {
          lVar9 = (**(code **)(*plVar12 + 0xe0))(plVar12,message,field,&local_90);
        }
        lVar9 = *(long *)(lVar9 + 8);
        if ((MapKey *)local_90.iter_ != &local_90.key_) {
          operator_delete(local_90.iter_,
                          CONCAT71(local_90.key_.val_.int64_value_._1_7_,
                                   local_90.key_.val_.bool_value_) + 1);
        }
        uVar4 = (uint)lVar9 | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + lVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    break;
  case TYPE_GROUP:
    if (*(int *)(field + 0x4c) != 3) {
      plVar12 = (long *)(**(code **)(*plVar12 + 0xd8))(plVar12,message,field,0);
      sVar13 = (**(code **)(*plVar12 + 0x60))(plVar12);
      return sVar13;
    }
    if (sVar13 != 0) {
      uVar14 = 0;
      sVar7 = 0;
      do {
        plVar11 = (long *)(**(code **)(*plVar12 + 0x1a0))(plVar12,message,field,uVar14 & 0xffffffff)
        ;
        lVar9 = (**(code **)(*plVar11 + 0x60))(plVar11);
        sVar7 = sVar7 + lVar9;
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    break;
  case TYPE_MESSAGE:
    if (*(int *)(field + 0x4c) != 3) {
      plVar12 = (long *)(**(code **)(*plVar12 + 0xd8))(plVar12,message,field,0);
      lVar9 = (**(code **)(*plVar12 + 0x60))(plVar12);
      uVar4 = (uint)lVar9 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      return (ulong)(iVar3 * 9 + 0x49U >> 6) + lVar9;
    }
    if (sVar13 != 0) {
      uVar14 = 0;
      sVar7 = 0;
      do {
        plVar11 = (long *)(**(code **)(*plVar12 + 0x1a0))(plVar12,message,field,uVar14 & 0xffffffff)
        ;
        lVar9 = (**(code **)(*plVar11 + 0x60))(plVar11);
        uVar4 = (uint)lVar9 | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + lVar9 + (ulong)(iVar3 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    break;
  case TYPE_UINT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        uVar4 = (**(code **)(*plVar12 + 0x160))(plVar12,message,field,uVar14 & 0xffffffff);
        iVar3 = 0x1f;
        if ((uVar4 | 1) != 0) {
          for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    uVar4 = (**(code **)(*plVar12 + 0x98))(plVar12,message,field);
    goto LAB_005ce1e9;
  case TYPE_ENUM:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        lVar9 = (**(code **)(*plVar12 + 400))(plVar12,message,field,uVar14 & 0xffffffff);
        if ((int)*(uint *)(lVar9 + 0x10) < 0) {
          uVar10 = 10;
        }
        else {
          uVar4 = *(uint *)(lVar9 + 0x10) | 1;
          iVar3 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          uVar10 = (ulong)(iVar3 * 9 + 0x49U >> 6);
        }
        sVar7 = sVar7 + uVar10;
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    lVar9 = (**(code **)(*plVar12 + 200))(plVar12,message,field);
    uVar4 = *(uint *)(lVar9 + 0x10);
LAB_005ce1e1:
    if ((int)uVar4 < 0) {
      return 10;
    }
LAB_005ce1e9:
    iVar3 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_005ce23e;
  case TYPE_SINT32:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        iVar3 = (**(code **)(*plVar12 + 0x150))(plVar12,message,field,uVar14 & 0xffffffff);
        uVar4 = iVar3 >> 0x1f ^ iVar3 * 2 | 1;
        iVar3 = 0x1f;
        if (uVar4 != 0) {
          for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar7 = sVar7 + (iVar3 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    iVar3 = (**(code **)(*plVar12 + 0x88))(plVar12,message,field);
    uVar4 = iVar3 >> 0x1f ^ iVar3 * 2 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    goto LAB_005ce23e;
  case MAX_TYPE:
    if (*(int *)(field + 0x4c) == 3) {
      if (sVar13 == 0) {
        return 0;
      }
      uVar14 = 0;
      sVar7 = 0;
      do {
        lVar9 = (**(code **)(*plVar12 + 0x158))(plVar12,message,field,uVar14 & 0xffffffff);
        uVar10 = lVar9 >> 0x3f ^ lVar9 * 2 | 1;
        lVar9 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        sVar7 = sVar7 + ((int)lVar9 * 9 + 0x49U >> 6);
        uVar14 = uVar14 + 1;
      } while (sVar13 != uVar14);
      return sVar7;
    }
    lVar9 = (**(code **)(*plVar12 + 0x90))(plVar12,message,field);
    uVar14 = lVar9 >> 0x3f ^ lVar9 * 2;
LAB_005ce236:
    lVar9 = 0x3f;
    if ((uVar14 | 1) != 0) {
      for (; (uVar14 | 1) >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    iVar3 = (int)lVar9;
LAB_005ce23e:
    return (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  return 0;
}

Assistant:

size_t WireFormat::FieldDataOnlyByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t data_size = 0;

  if (field->is_map()) {
    MapFieldBase* map_field =
        message_reflection->MapData(const_cast<Message*>(&message), field);
    if (map_field->IsMapValid()) {
      MapIterator iter(const_cast<Message*>(&message), field);
      MapIterator end(const_cast<Message*>(&message), field);
      const FieldDescriptor* key_field = field->message_type()->field(0);
      const FieldDescriptor* value_field = field->message_type()->field(1);
      for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
           ++iter) {
        size_t size = kMapEntryTagByteSize;
        size += MapKeyDataOnlyByteSize(key_field, iter.GetKey());
        size += MapValueRefDataOnlyByteSize(value_field, iter.GetValueRef());
        data_size += WireFormatLite::LengthDelimitedSize(size);
      }
      return data_size;
    }
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count =
        internal::FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  switch (field->type()) {
#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                     \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      if (field->is_repeated()) {                                          \
        for (int j = 0; j < count; j++) {                                  \
          data_size += WireFormatLite::TYPE_METHOD##Size(                  \
            message_reflection->GetRepeated##CPPTYPE_METHOD(               \
              message, field, j));                                         \
        }                                                                  \
      } else {                                                             \
        data_size += WireFormatLite::TYPE_METHOD##Size(                    \
          message_reflection->Get##CPPTYPE_METHOD(message, field));        \
      }                                                                    \
      break;

#define HANDLE_FIXED_TYPE(TYPE, TYPE_METHOD)                               \
    case FieldDescriptor::TYPE_##TYPE:                                     \
      data_size += count * WireFormatLite::k##TYPE_METHOD##Size;           \
      break;

    HANDLE_TYPE( INT32,  Int32,  Int32)
    HANDLE_TYPE( INT64,  Int64,  Int64)
    HANDLE_TYPE(SINT32, SInt32,  Int32)
    HANDLE_TYPE(SINT64, SInt64,  Int64)
    HANDLE_TYPE(UINT32, UInt32, UInt32)
    HANDLE_TYPE(UINT64, UInt64, UInt64)

    HANDLE_FIXED_TYPE( FIXED32,  Fixed32)
    HANDLE_FIXED_TYPE( FIXED64,  Fixed64)
    HANDLE_FIXED_TYPE(SFIXED32, SFixed32)
    HANDLE_FIXED_TYPE(SFIXED64, SFixed64)

    HANDLE_FIXED_TYPE(FLOAT , Float )
    HANDLE_FIXED_TYPE(DOUBLE, Double)

    HANDLE_FIXED_TYPE(BOOL, Bool)

    HANDLE_TYPE(GROUP  , Group  , Message)
    HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE
#undef HANDLE_FIXED_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      if (field->is_repeated()) {
        for (int j = 0; j < count; j++) {
          data_size += WireFormatLite::EnumSize(
            message_reflection->GetRepeatedEnum(message, field, j)->number());
        }
      } else {
        data_size += WireFormatLite::EnumSize(
          message_reflection->GetEnum(message, field)->number());
      }
      break;
    }

    // Handle strings separately so that we can get string references
    // instead of copying.
    case FieldDescriptor::TYPE_STRING:
    case FieldDescriptor::TYPE_BYTES: {
      for (int j = 0; j < count; j++) {
        string scratch;
        const string& value = field->is_repeated() ?
          message_reflection->GetRepeatedStringReference(
            message, field, j, &scratch) :
          message_reflection->GetStringReference(message, field, &scratch);
        data_size += WireFormatLite::StringSize(value);
      }
      break;
    }
  }
  return data_size;
}